

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
          (LogMessage *this,char ch,size_t num)

{
  pointer pLVar1;
  Span<char> *pSVar2;
  size_t sVar3;
  pointer pcVar4;
  Span<char> *pSVar5;
  size_type n;
  Span<char> msg;
  Span<char> msg_00;
  undefined1 local_58 [8];
  Span<char> str_start;
  Span<char> value_start;
  undefined1 auStack_30 [7];
  uint8_t tag_value;
  Span<char> encoded_remaining_copy;
  size_t num_local;
  char ch_local;
  LogMessage *this_local;
  
  encoded_remaining_copy.len_ = num;
  pLVar1 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  pSVar2 = LogMessageData::encoded_remaining(pLVar1);
  pSVar5 = (Span<char> *)pSVar2->ptr_;
  encoded_remaining_copy.ptr_ = (pointer)pSVar2->len_;
  _auStack_30 = pSVar5;
  sVar3 = BufferSizeFor(6,kLengthDelimited);
  join_0x00000010_0x00000000_ =
       EncodeMessageStart(7,sVar3 + encoded_remaining_copy.len_,(Span<char> *)auStack_30);
  _local_58 = EncodeMessageStart(6,encoded_remaining_copy.len_,(Span<char> *)auStack_30);
  pcVar4 = Span<char>::data((Span<char> *)local_58);
  if (pcVar4 == (pointer)0x0) {
    pLVar1 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pSVar5 = LogMessageData::encoded_remaining(pLVar1);
    pLVar1 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pSVar2 = LogMessageData::encoded_remaining(pLVar1);
    n = Span<char>::size(pSVar2);
    Span<char>::remove_suffix(pSVar5,n);
  }
  else {
    AppendTruncated(ch,encoded_remaining_copy.len_,(Span<char> *)auStack_30);
    msg.len_ = (size_type)auStack_30;
    msg.ptr_ = str_start.ptr_;
    EncodeMessageLength((log_internal *)local_58,msg,pSVar5);
    msg_00.len_ = (size_type)auStack_30;
    msg_00.ptr_ = value_start.ptr_;
    EncodeMessageLength((log_internal *)str_start.len_,msg_00,pSVar5);
    pLVar1 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pSVar5 = LogMessageData::encoded_remaining(pLVar1);
    pSVar5->ptr_ = (pointer)_auStack_30;
    pSVar5->len_ = (size_type)encoded_remaining_copy.ptr_;
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(char ch, size_t num) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto value_start = EncodeMessageStart(
      EventTag::kValue,
      BufferSizeFor(tag_value, WireType::kLengthDelimited) + num,
      &encoded_remaining_copy);
  auto str_start = EncodeMessageStart(tag_value, num, &encoded_remaining_copy);
  if (str_start.data()) {
    // The field headers fit.
    log_internal::AppendTruncated(ch, num, encoded_remaining_copy);
    EncodeMessageLength(str_start, &encoded_remaining_copy);
    EncodeMessageLength(value_start, &encoded_remaining_copy);
    data_->encoded_remaining() = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining()` so we don't
    // write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
  }
}